

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O2

void __thiscall
duckdb::RecursiveCTEState::RecursiveCTEState
          (RecursiveCTEState *this,ClientContext *context,PhysicalRecursiveCTE *op)

{
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> _Var2;
  ClientContext *args;
  const_reference pvVar3;
  Allocator *args_1;
  idx_t i;
  ulong __n;
  vector<duckdb::BoundAggregateExpression_*,_true> payload_aggregates_ptr;
  _Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false> local_88;
  unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>,_true>
  *local_80;
  ColumnDataCollection *local_78;
  ClientContext *local_70;
  _Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
  local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__RecursiveCTEState_017a6e38;
  local_80 = &this->ht;
  (this->ht).
  super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
       (GroupedAggregateHashTable *)0x0;
  (this->intermediate_table_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->intermediate_table_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->intermediate_table_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->intermediate_table_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->intermediate_table_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &(op->super_PhysicalOperator).types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  local_70 = context;
  ColumnDataCollection::ColumnDataCollection
            (&this->intermediate_table,context,(vector<duckdb::LogicalType,_true> *)&local_48,
             BUFFER_MANAGER_ALLOCATOR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  (this->scan_state).current_chunk_state.handles._M_h._M_buckets =
       &(this->scan_state).current_chunk_state.handles._M_h._M_single_bucket;
  (this->scan_state).current_chunk_state.handles._M_h._M_bucket_count = 1;
  (this->scan_state).current_chunk_state.handles._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->scan_state).current_chunk_state.handles._M_h._M_element_count = 0;
  (this->scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->scan_state).current_chunk_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
  (this->scan_state).current_chunk_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->scan_state).current_chunk_state.properties = INVALID;
  (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->scan_state).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
           .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 2) = 0;
  local_78 = &this->intermediate_table;
  SelectionVector::SelectionVector(&this->new_groups,0x800);
  AggregateHTScanState::AggregateHTScanState(&this->ht_scan_state);
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (__n = 0; args = local_70,
      __n < (ulong)((long)(op->payload_aggregates).
                          super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(op->payload_aggregates).
                          super_vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>,_true>
             ::get<true>(&op->payload_aggregates,__n);
    local_88._M_head_impl =
         (GroupedAggregateHashTable *)
         (pvVar3->
         super_unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BoundAggregateExpression_*,_std::default_delete<duckdb::BoundAggregateExpression>_>
         .super__Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>::
    emplace_back<duckdb::BoundAggregateExpression*>
              ((vector<duckdb::BoundAggregateExpression*,std::allocator<duckdb::BoundAggregateExpression*>>
                *)&local_68,(BoundAggregateExpression **)&local_88);
  }
  args_1 = BufferAllocator::Get(local_70);
  make_uniq<duckdb::GroupedAggregateHashTable,duckdb::ClientContext&,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::vector<duckdb::BoundAggregateExpression*,true>&>
            ((duckdb *)&local_88,args,args_1,&op->distinct_types,&op->payload_types,
             (vector<duckdb::BoundAggregateExpression_*,_true> *)&local_68);
  _Var2._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (GroupedAggregateHashTable *)0x0;
  _Var1._M_head_impl =
       (local_80->
       super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
       .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl;
  (local_80->
  super_unique_ptr<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::GroupedAggregateHashTable,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GroupedAggregateHashTable_*,_std::default_delete<duckdb::GroupedAggregateHashTable>_>
  .super__Head_base<0UL,_duckdb::GroupedAggregateHashTable_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  if (_Var1._M_head_impl != (GroupedAggregateHashTable *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseAggregateHashTable + 8))();
    if (local_88._M_head_impl != (GroupedAggregateHashTable *)0x0) {
      (*((local_88._M_head_impl)->super_BaseAggregateHashTable)._vptr_BaseAggregateHashTable[1])();
    }
  }
  ::std::
  _Vector_base<duckdb::BoundAggregateExpression_*,_std::allocator<duckdb::BoundAggregateExpression_*>_>
  ::~_Vector_base(&local_68);
  return;
}

Assistant:

explicit RecursiveCTEState(ClientContext &context, const PhysicalRecursiveCTE &op)
	    : intermediate_table(context, op.GetTypes()), new_groups(STANDARD_VECTOR_SIZE) {

		vector<BoundAggregateExpression *> payload_aggregates_ptr;
		for (idx_t i = 0; i < op.payload_aggregates.size(); i++) {
			auto &dat = op.payload_aggregates[i];
			payload_aggregates_ptr.push_back(dat.get());
		}

		ht = make_uniq<GroupedAggregateHashTable>(context, BufferAllocator::Get(context), op.distinct_types,
		                                          op.payload_types, payload_aggregates_ptr);
	}